

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle_belief.cpp
# Opt level: O3

vector<despot::State_*,_std::allocator<despot::State_*>_> *
despot::ParticleBelief::Resample
          (vector<despot::State_*,_std::allocator<despot::State_*>_> *__return_storage_ptr__,int num
          ,Belief *belief,History *history,int hstart)

{
  DSPOMDP *pDVar1;
  iterator __position;
  bool bVar2;
  double dVar3;
  State *pSVar4;
  vector<despot::State*,std::allocator<despot::State*>> *pvVar5;
  Belief *pBVar6;
  uint uVar7;
  pointer ppSVar8;
  log_ostream *plVar9;
  ostream *poVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar19;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar20;
  double dVar21;
  State *particle;
  OBS_TYPE obs;
  double reward;
  State *local_c0;
  double local_b8;
  long local_a8;
  double local_a0;
  State *local_98;
  ulong uStack_90;
  long local_88;
  ulong local_80;
  vector<despot::State*,std::allocator<despot::State*>> *local_78;
  int local_6c;
  int local_68;
  int local_64;
  ulong local_60;
  ulong local_58;
  Belief *local_50;
  double local_48;
  undefined1 local_40 [8];
  undefined1 local_38 [8];
  
  (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a0 = -INFINITY;
  uVar11 = 0;
  if (num < 1) {
    local_a8 = 0;
    local_c0 = (State *)0x0;
    uVar17 = 0;
  }
  else {
    local_6c = num * 200;
    local_60 = (ulong)hstart;
    local_48 = 1.0 / (double)num;
    iVar13 = 0;
    iVar14 = 0;
    local_c0 = (State *)0x0;
    local_80 = 0;
    local_a8 = 0;
    local_78 = (vector<despot::State*,std::allocator<despot::State*>> *)__return_storage_ptr__;
    local_50 = belief;
    do {
      pBVar6 = local_50;
      pvVar5 = local_78;
      local_64 = iVar13;
      local_58 = uVar11;
      if ((long)(local_80 - (long)local_c0) >> 3 == (long)iVar14) {
        (*local_50->_vptr_Belief[2])(&local_98,local_50);
        lVar12 = local_88;
        pSVar4 = local_98;
        local_80 = uStack_90;
        local_98 = (State *)0x0;
        uStack_90 = 0;
        local_88 = 0;
        if ((local_c0 != (State *)0x0) &&
           (operator_delete(local_c0,local_a8 - (long)local_c0), local_98 != (State *)0x0)) {
          operator_delete(local_98,local_88 - (long)local_98);
        }
        local_a8 = lVar12;
        iVar14 = 0;
        local_c0 = pSVar4;
      }
      local_98 = (State *)(&local_c0->_vptr_State)[iVar14];
      local_b8 = 0.0;
      local_68 = iVar14;
      if (local_60 <
          (ulong)((long)(history->actions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(history->actions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2)) {
        local_b8 = 0.0;
        uVar11 = local_60;
        do {
          pSVar4 = local_98;
          pDVar1 = pBVar6->model_;
          dVar21 = Random::NextDouble((Random *)&Random::RANDOM);
          (*pDVar1->_vptr_DSPOMDP[2])
                    (SUB84(dVar21,0),pDVar1,pSVar4,
                     (ulong)(uint)(history->actions_).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar11],local_38,local_40
                    );
          (*pBVar6->model_->_vptr_DSPOMDP[7])
                    (pBVar6->model_,
                     (history->observations_).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar11],local_98,
                     (ulong)(uint)(history->actions_).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar11]);
          if ((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) < 0.0 ||
              (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) == 0.0) {
            (*pBVar6->model_->_vptr_DSPOMDP[0x17])(pBVar6->model_,local_98);
            break;
          }
          dVar21 = log((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
          local_b8 = local_b8 + dVar21;
          uVar11 = uVar11 + 1;
        } while (uVar11 < (ulong)((long)(history->actions_).
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_finish -
                                  (long)(history->actions_).
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start >> 2));
      }
      uVar11 = local_58;
      if ((local_98->super_MemoryObject).allocated_ == true) {
        local_98->weight = local_b8;
        __position._M_current = *(State ***)(pvVar5 + 8);
        if (__position._M_current == *(State ***)(pvVar5 + 0x10)) {
          std::vector<despot::State*,std::allocator<despot::State*>>::
          _M_realloc_insert<despot::State*const&>(pvVar5,__position,&local_98);
        }
        else {
          *__position._M_current = local_98;
          *(long *)(pvVar5 + 8) = *(long *)(pvVar5 + 8) + 8;
        }
        uVar19 = SUB84(local_a0,0);
        uVar20 = (undefined4)((ulong)local_a0 >> 0x20);
        if (local_a0 <= local_b8) {
          uVar19 = SUB84(local_b8,0);
          uVar20 = (undefined4)((ulong)local_b8 >> 0x20);
        }
        local_a0 = (double)CONCAT44(uVar20,uVar19);
        uVar11 = (ulong)((int)uVar11 + 1);
      }
      if ((int)uVar11 == num) {
        uVar7 = (int)((ulong)((long)*(pointer *)(local_78 + 8) - *(long *)local_78) >> 3) - 1;
        uVar11 = (ulong)(uint)num;
        if (-1 < (int)uVar7) {
          uVar17 = (ulong)uVar7;
          uVar18 = uVar17 * 8 ^ 0xfffffffffffffff8;
          lVar12 = uVar17 * 8 + 8;
          uVar11 = (ulong)(uint)num;
          lVar15 = uVar17 + 1;
          do {
            pvVar5 = local_78;
            dVar21 = *(double *)(*(long *)(*(long *)local_78 + -8 + lVar15 * 8) + 0x18);
            dVar3 = log(local_48);
            if (dVar21 - local_a0 < dVar3) {
              (*local_50->model_->_vptr_DSPOMDP[0x17])
                        (local_50->model_,*(undefined8 *)(*(long *)pvVar5 + -8 + lVar15 * 8));
              lVar16 = *(long *)pvVar5;
              ppSVar8 = *(pointer *)(pvVar5 + 8);
              if ((pointer)(lVar16 + lVar12) != ppSVar8) {
                memmove((void *)(lVar16 + lVar15 * 8 + -8),(void *)(lVar16 + lVar15 * 8),
                        (long)ppSVar8 + (uVar18 - lVar16));
                ppSVar8 = *(pointer *)(pvVar5 + 8);
              }
              *(pointer *)(pvVar5 + 8) = ppSVar8 + -1;
              uVar11 = (ulong)((int)uVar11 - 1);
            }
            uVar18 = uVar18 + 8;
            lVar12 = lVar12 + -8;
            lVar16 = lVar15 + -1;
            bVar2 = 0 < lVar15;
            lVar15 = lVar16;
          } while (lVar16 != 0 && bVar2);
        }
      }
      iVar13 = local_64 + 1;
      iVar14 = local_68 + 1;
    } while (((int)uVar11 < num) || (iVar13 < local_6c));
    uVar17 = (ulong)iVar14;
    __return_storage_ptr__ = (vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_78;
    uVar11 = local_80;
    belief = local_50;
  }
  for (; uVar17 < (ulong)((long)(uVar11 - (long)local_c0) >> 3); uVar17 = uVar17 + 1) {
    (*belief->model_->_vptr_DSPOMDP[0x17])(belief->model_,(&local_c0->_vptr_State)[uVar17]);
  }
  ppSVar8 = *(pointer *)__return_storage_ptr__;
  if (*(pointer *)((long)__return_storage_ptr__ + 8) == ppSVar8) {
    uVar11 = 0;
    dVar21 = 0.0;
  }
  else {
    dVar21 = 0.0;
    uVar17 = 0;
    do {
      dVar3 = exp(ppSVar8[uVar17]->weight - local_a0);
      ppSVar8 = *(pointer *)__return_storage_ptr__;
      ppSVar8[uVar17]->weight = dVar3;
      dVar21 = dVar21 + dVar3;
      uVar17 = uVar17 + 1;
      uVar11 = (long)*(pointer *)((long)__return_storage_ptr__ + 8) - (long)ppSVar8 >> 3;
    } while (uVar17 < uVar11);
  }
  if (uVar11 != 0) {
    uVar17 = 0;
    do {
      ppSVar8[uVar17]->weight = ppSVar8[uVar17]->weight / dVar21;
      uVar17 = uVar17 + 1;
    } while (uVar11 != uVar17);
  }
  iVar13 = logging::level();
  if ((0 < iVar13) && (iVar13 = logging::level(), 3 < iVar13)) {
    plVar9 = logging::stream(4);
    std::__ostream_insert<char,std::char_traits<char>>
              (&plVar9->super_ostream,"[Belief::Resample] Resampled ",0x1d);
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)plVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," particles",10);
    std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
  }
  if (*(pointer *)((long)__return_storage_ptr__ + 8) != *(pointer *)__return_storage_ptr__) {
    uVar11 = 0;
    do {
      iVar13 = logging::level();
      if ((0 < iVar13) && (iVar13 = logging::level(), 4 < iVar13)) {
        plVar9 = logging::stream(5);
        std::__ostream_insert<char,std::char_traits<char>>(&plVar9->super_ostream," ",1);
        poVar10 = (ostream *)std::ostream::operator<<(plVar9,(int)uVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," = ",3);
        poVar10 = despot::operator<<(poVar10,*(State **)
                                              (*(long *)__return_storage_ptr__ + uVar11 * 8));
        std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < (ulong)((long)*(pointer *)((long)__return_storage_ptr__ + 8) -
                              *(long *)__return_storage_ptr__ >> 3));
  }
  if (local_c0 != (State *)0x0) {
    operator_delete(local_c0,local_a8 - (long)local_c0);
  }
  return (vector<despot::State_*,_std::allocator<despot::State_*>_> *)
         (vector<despot::State*,std::allocator<despot::State*>> *)__return_storage_ptr__;
}

Assistant:

vector<State*> ParticleBelief::Resample(int num, const Belief& belief, History history,
	int hstart) {
	double reward;
	OBS_TYPE obs;

	vector<State*> sample;
	int count = 0;
	int pos = 0;
	double max_wgt = Globals::NEG_INFTY;
	vector<State*> particles;
	int trial = 0;
	while (count < num || trial < 200 * num) {
		// Pick next particle
		if (pos == particles.size()) {
			particles = belief.Sample(num);
			pos = 0;
		}
		State* particle = particles[pos];

		trial++;

		// Step through history
		double log_wgt = 0;
		for (int i = hstart; i < history.Size(); i++) {
			belief.model_->Step(*particle, Random::RANDOM.NextDouble(),
				history.Action(i), reward, obs);

			double prob = belief.model_->ObsProb(history.Observation(i),
				*particle, history.Action(i));
			if (prob > 0) {
				log_wgt += log(prob);
			} else {
				belief.model_->Free(particle);
				break;
			}
		}

		// Add to sample if survived
		if (particle->IsAllocated()) {
			particle->weight = log_wgt;
			sample.push_back(particle);

			max_wgt = max(log_wgt, max_wgt);
			count++;
		}

		// Remove particles with very small weights
		if (count == num) {
			for (int i = sample.size() - 1; i >= 0; i--) {
				if (sample[i]->weight - max_wgt < log(1.0 / num)) {
					belief.model_->Free(sample[i]);
					sample.erase(sample.begin() + i);
					count--;
				}
			}
		}

		pos++;
	}

	// Free unused particles
	for (int i = pos; i < particles.size(); i++)
		belief.model_->Free(particles[i]);

	double total_weight = 0;
	for (int i = 0; i < sample.size(); i++) {
		sample[i]->weight = exp(sample[i]->weight - max_wgt);
		total_weight += sample[i]->weight;
	}
	for (int i = 0; i < sample.size(); i++) {
		sample[i]->weight = sample[i]->weight / total_weight;
	}

	logd << "[Belief::Resample] Resampled " << sample.size() << " particles"
		<< endl;
	for (int i = 0; i < sample.size(); i++) {
		logv << " " << i << " = " << *sample[i] << endl;
	}

	return sample;
}